

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O2

bool __thiscall ary::KeypointPlaneLocalizer::add(KeypointPlaneLocalizer *this,Mat *image,float size)

{
  element_type *peVar1;
  char cVar2;
  undefined8 uVar3;
  pointer __x;
  Point2f PVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _InputArray local_270;
  KeypointPlaneLocalizer *local_258;
  _InputArray local_250;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoints;
  float local_218;
  float fStack_214;
  _InputArray local_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  KeypointPlaneModel local_1d0;
  Mat tmp_image1;
  Mat tmp_image2;
  Mat descriptors;
  
  local_258 = this;
  KeypointPlaneModel::KeypointPlaneModel(&local_1d0);
  cv::Mat::Mat(&tmp_image1);
  cv::Mat::Mat(&tmp_image2);
  cv::Mat::operator=(&tmp_image1,image);
  local_1d0.size.width = (float)(int)((ulong)*(undefined8 *)tmp_image1.size.p >> 0x20) * size;
  local_1d0.size.height = (float)(int)*(undefined8 *)tmp_image1.size.p * size;
  while( true ) {
    cv::Mat::Mat(&descriptors);
    keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar1 = (local_258->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_270.obj = &tmp_image1;
    uVar3 = cv::noArray();
    (**(code **)(*(long *)peVar1 + 0x40))(peVar1,&local_270,&keypoints,uVar3);
    peVar1 = (local_258->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_250.sz.width = 0;
    local_250.sz.height = 0;
    local_250.flags = 0x2010000;
    local_270.obj = &tmp_image1;
    local_250.obj = &descriptors;
    (**(code **)(*(long *)peVar1 + 0x50))(peVar1,&local_270,&keypoints,&local_250);
    local_1e8 = *(undefined8 *)tmp_image1.size.p;
    uStack_1e0 = 0;
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      local_270.sz.width = 0;
      local_270.sz.height = 0;
      local_270.flags = 0x1010000;
      local_250.sz.width = 0;
      local_250.sz.height = 0;
      local_270.obj = &local_1d0.descriptors;
      local_200.sz.width = 0;
      local_200.sz.height = 0;
      local_250.flags = 0x1010000;
      local_200.flags = 0x2010000;
      local_250.obj = &descriptors;
      local_200.obj = local_270.obj;
      cv::vconcat(&local_270,&local_250,(_OutputArray *)&local_200);
    }
    else {
      local_270.sz.width = 0;
      local_270.sz.height = 0;
      local_270.flags = 0x2010000;
      local_270.obj = &local_1d0.descriptors;
      cv::Mat::copyTo((_OutputArray *)&descriptors);
    }
    auVar6._8_4_ = (float)(int)uStack_1e0;
    auVar6._12_4_ = (float)uStack_1e0._4_4_;
    auVar6._4_4_ = (float)(int)local_1e8;
    auVar6._0_4_ = (float)local_1e8._4_4_;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = local_1d0.size.width;
    auVar5._4_4_ = local_1d0.size.height;
    auVar6 = divps(auVar5,auVar6);
    for (__x = keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start;
        __x != keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_finish; __x = __x + 1) {
      local_218 = auVar6._0_4_;
      fStack_214 = auVar6._4_4_;
      PVar4.x = (__x->pt).x * local_218;
      PVar4.y = (__x->pt).y * fStack_214;
      __x->pt = PVar4;
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back(&local_1d0.keypoints,__x);
    }
    if ((local_258->type == AKAZE) || (local_1e8._4_4_ * (int)local_1e8 < 30000)) break;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_250.sz.width = 0;
    local_250.sz.height = 0;
    local_250.flags = 0x2010000;
    local_200.flags = 0;
    local_200._4_4_ = 0;
    local_270.obj = &tmp_image1;
    local_250.obj = &tmp_image2;
    cv::pyrDown(&local_270,(_OutputArray *)&local_250,(Size_ *)&local_200,4);
    cv::Mat::operator=(&tmp_image1,&tmp_image2);
    std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
              (&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
    cv::Mat::~Mat(&descriptors);
  }
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  cv::Mat::~Mat(&descriptors);
  std::vector<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>::push_back
            (&local_258->models,&local_1d0);
  cv::Mat::~Mat(&tmp_image2);
  cv::Mat::~Mat(&tmp_image1);
  KeypointPlaneModel::~KeypointPlaneModel(&local_1d0);
  return true;
}

Assistant:

bool KeypointPlaneLocalizer::add(const Mat& image, float size) {

	KeypointPlaneModel model;

	Mat tmp_image1, tmp_image2;
	tmp_image1 = image;

	model.size = Size2f(tmp_image1.size().width * size, tmp_image1.size().height * size);

	while (true) {
		Mat descriptors;
		vector<KeyPoint> keypoints;

		detector->detect(tmp_image1, keypoints);
		detector->compute(tmp_image1, keypoints, descriptors);
		//descriptors.convertTo(descriptors, CV_32F);

		Size size = tmp_image1.size();
		if (model.descriptors.empty()) {
			descriptors.copyTo(model.descriptors);
		} else {
			vconcat(model.descriptors, descriptors, model.descriptors);
		}

		float xscale = (float) model.size.width / (float) size.width;
		float yscale = (float) model.size.height / (float) size.height;

		for (vector<KeyPoint>::iterator it = keypoints.begin(); it != keypoints.end(); it++) {
			(*it).pt.x *= xscale;
			(*it).pt.y *= yscale;
			model.keypoints.push_back(*it);
		}

		if (type == AKAZE) break; // No need for additional features.

		if (size.width * size.height < 30000) break;

		pyrDown(tmp_image1, tmp_image2, Size());
		tmp_image1 = tmp_image2;
	}

	models.push_back(model);

	return true;
}